

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

string * __thiscall
llvm::sys::path::convert_to_slash_abi_cxx11_
          (string *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined1 local_30 [8];
  StringRef path_local;
  
  path_local.Data = path.Data;
  local_30 = (undefined1  [8])this;
  StringRef::str_abi_cxx11_(__return_storage_ptr__,(StringRef *)local_30);
  if ((int)path.Length == 0) {
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    path_local.Length._6_1_ = 0x5c;
    path_local.Length._7_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),
               (char *)((long)&path_local.Length + 6),(char *)((long)&path_local.Length + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_slash(StringRef path, Style style) {
  if (real_style(style) != Style::windows)
    return path;

  std::string s = path.str();
  std::replace(s.begin(), s.end(), '\\', '/');
  return s;
}